

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined1 local_100 [8];
  string file;
  long local_d8;
  ulong local_d0;
  FilePath *local_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  undefined8 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  FilePath local_78;
  size_type *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int number_local;
  
  local_100 = (undefined1  [8])&file._M_string_length;
  file._M_dataplus._M_p = (pointer)0x0;
  file._M_string_length._0_1_ = 0;
  __str.field_2._12_4_ = number;
  if (number == 0) {
    pcVar3 = (base_name->pathname_)._M_dataplus._M_p;
    local_58 = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar3,pcVar3 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_58);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
    paVar1 = &local_78.pathname_.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_78.pathname_.field_2._M_allocated_capacity = *psVar6;
      local_78.pathname_.field_2._8_8_ = plVar5[3];
      local_78.pathname_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.pathname_.field_2._M_allocated_capacity = *psVar6;
      local_78.pathname_._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_78.pathname_._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_100,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.pathname_._M_dataplus._M_p);
    }
    if (local_58 != &__str._M_string_length) {
      operator_delete(local_58);
    }
    goto LAB_00133b85;
  }
  pcVar3 = (base_name->pathname_)._M_dataplus._M_p;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar3,pcVar3 + (base_name->pathname_)._M_string_length);
  std::__cxx11::string::append((char *)&local_b8);
  StreamableToString<int>
            ((string *)((long)&file.field_2 + 8),(int *)(__str.field_2._M_local_buf + 0xc));
  uVar7 = 0xf;
  if (local_b8 != local_a8) {
    uVar7 = local_a8[0];
  }
  if (uVar7 < (ulong)(local_d8 + local_b0)) {
    uVar7 = 0xf;
    if ((ulong *)file.field_2._8_8_ != &stack0xffffffffffffff30) {
      uVar7 = local_d0;
    }
    if (uVar7 < (ulong)(local_d8 + local_b0)) goto LAB_00133942;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)((long)&file.field_2 + 8),0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_00133942:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,file.field_2._8_8_);
  }
  local_98 = &local_88;
  puVar2 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar2) {
    local_88 = *puVar2;
    uStack_80 = puVar4[3];
  }
  else {
    local_88 = *puVar2;
    local_98 = (undefined8 *)*puVar4;
  }
  local_90 = puVar4[1];
  *puVar4 = puVar2;
  puVar4[1] = 0;
  *(undefined1 *)puVar2 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    __str._M_string_length = *psVar6;
    __str.field_2._M_allocated_capacity = plVar5[3];
    local_58 = &__str._M_string_length;
  }
  else {
    __str._M_string_length = *psVar6;
    local_58 = (size_type *)*plVar5;
  }
  __str._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_c0 = __return_storage_ptr__;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_58);
  paVar1 = &local_78.pathname_.field_2;
  psVar6 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_78.pathname_.field_2._M_allocated_capacity = *psVar6;
    local_78.pathname_.field_2._8_8_ = puVar4[3];
    local_78.pathname_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_78.pathname_.field_2._M_allocated_capacity = *psVar6;
    local_78.pathname_._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_78.pathname_._M_string_length = puVar4[1];
  *puVar4 = psVar6;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_100,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.pathname_._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.pathname_._M_dataplus._M_p);
  }
  if (local_58 != &__str._M_string_length) {
    operator_delete(local_58);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if ((ulong *)file.field_2._8_8_ != &stack0xffffffffffffff30) {
    operator_delete((void *)file.field_2._8_8_);
  }
  __return_storage_ptr__ = local_c0;
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
    __return_storage_ptr__ = local_c0;
  }
LAB_00133b85:
  FilePath(&local_78,(string *)local_100);
  ConcatPaths(__return_storage_ptr__,directory,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.pathname_._M_dataplus._M_p != &local_78.pathname_.field_2) {
    operator_delete(local_78.pathname_._M_dataplus._M_p);
  }
  if (local_100 != (undefined1  [8])&file._M_string_length) {
    operator_delete((void *)local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}